

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O2

void Mpm_ObjAddChoiceCutsToStore(Mpm_Man_t *p,Mig_Obj_t *pRoot,Mig_Obj_t *pObj,int ReqTime)

{
  Mig_Fan_t MVar1;
  Mig_Fan_t MVar2;
  int h;
  uint uVar3;
  int ArrTime;
  Mpm_Cut_t *pMVar4;
  
  MVar1 = pObj->pFans[3];
  MVar2 = pRoot->pFans[3];
  h = Mpm_ObjCutList(p,pObj);
  while( true ) {
    if (h == 0) {
      return;
    }
    pMVar4 = Mpm_CutFetch(p,h);
    if (pMVar4 == (Mpm_Cut_t *)0x0) break;
    h = pMVar4->hNext;
    uVar3 = Abc_Lit2Var(pMVar4->pLeaves[0]);
    if ((uVar3 != (uint)pObj->pFans[3] >> 1) &&
       (ArrTime = Mpm_CutGetArrTime(p,pMVar4), ArrTime <= ReqTime)) {
      *(uint *)&pMVar4->field_0x4 =
           *(uint *)&pMVar4->field_0x4 ^ (((uint)MVar1 ^ (uint)MVar2) & 1) << 0x19;
      pMVar4 = Mpm_ManMergeCuts(p,pMVar4,(Mpm_Cut_t *)0x0,(Mpm_Cut_t *)0x0);
      Mpm_ObjAddCutToStore(p,pMVar4,ArrTime);
    }
  }
  return;
}

Assistant:

void Mpm_ObjAddChoiceCutsToStore( Mpm_Man_t * p, Mig_Obj_t * pRoot, Mig_Obj_t * pObj, int ReqTime )
{
    Mpm_Cut_t * pCut;
    int hCut, hNext, ArrTime;
    int fCompl = Mig_ObjPhase(pRoot) ^ Mig_ObjPhase(pObj);
    Mpm_ObjForEachCutSafe( p, pObj, hCut, pCut, hNext )
    {
        if ( Abc_Lit2Var(pCut->pLeaves[0]) == Mig_ObjId(pObj) )
            continue;
        ArrTime = Mpm_CutGetArrTime( p, pCut );
        if ( ArrTime > ReqTime )
            continue;
        pCut->fCompl ^= fCompl;
        pCut = Mpm_ManMergeCuts( p, pCut, NULL, NULL );
        Mpm_ObjAddCutToStore( p, pCut, ArrTime );
    }
}